

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::DefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field,bool immutable,
          ClassNameResolver *name_resolver,Options *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float value;
  double value_00;
  java jVar2;
  size_t *psVar3;
  long lVar4;
  char *pcVar5;
  Descriptor *descriptor;
  long *plVar6;
  EnumDescriptor *descriptor_00;
  EnumValueDescriptor *pEVar7;
  uint uVar8;
  undefined7 in_register_00000009;
  size_type *psVar9;
  Nonnull<char_*> pcVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  string_view src;
  string_view format;
  string_view src_00;
  string_view src_01;
  string_view format_00;
  string local_e8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  undefined1 local_88 [56];
  string local_50;
  
  uVar8 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4) - 1;
  if (9 < uVar8) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/helpers.cc"
               ,0x21a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              ((LogMessage *)&local_e8,(char (*) [16])"Can\'t get here.");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_e8);
  }
  src._M_str = (AlphaNum *)
               ((long)&switchD_001c20c2::switchdataD_0054f380 +
               (long)(int)(&switchD_001c20c2::switchdataD_0054f380)[uVar8]);
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)this[2] * 4)) {
  default:
    pcVar11 = (char *)&local_e8.field_2;
    pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        (*(int32_t *)(this + 0x50),pcVar11);
    local_e8._M_dataplus._M_p = pcVar10 + -(long)pcVar11;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    local_e8._M_string_length = (size_type)pcVar11;
    goto LAB_001c231a;
  case 2:
    paVar1 = &local_e8.field_2;
    pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        (*(int64_t *)(this + 0x50),paVar1->_M_local_buf);
    local_e8._M_dataplus._M_p = pcVar10 + -(long)paVar1;
    local_88._0_8_ = 1;
    local_88._8_8_ = "L";
    local_e8._M_string_length = (size_type)paVar1;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_e8,(AlphaNum *)local_88,src._M_str);
    return __return_storage_ptr__;
  case 4:
    paVar1 = &local_e8.field_2;
    pcVar10 = absl::lts_20250127::numbers_internal::FastIntToBuffer
                        (*(int64_t *)(this + 0x50),paVar1->_M_local_buf);
    local_e8._M_dataplus._M_p = pcVar10 + -(long)paVar1;
    local_e8._M_string_length = (size_type)paVar1;
    local_88._0_8_ = (AlphaNum *)(local_88 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,paVar1,pcVar10);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_88);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar9) {
      lVar4 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_e8.field_2._M_allocated_capacity = local_88._16_8_;
    local_50._M_dataplus._M_p = (pointer)local_88._0_8_;
    if ((AlphaNum *)local_88._0_8_ == (AlphaNum *)(local_88 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_001c2552;
  case 5:
    value_00 = *(double *)(this + 0x50);
    if (INFINITY <= value_00) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.POSITIVE_INFINITY";
      pcVar10 = "";
      goto LAB_001c231a;
    }
    if (value_00 <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.NEGATIVE_INFINITY";
      pcVar10 = "";
      goto LAB_001c231a;
    }
    if (NAN(value_00)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Double.NaN";
      pcVar10 = "";
      goto LAB_001c231a;
    }
    io::SimpleDtoa_abi_cxx11_((string *)local_b8,(io *)this,value_00);
    local_e8._M_dataplus._M_p = (pointer)local_b8._8_8_;
    local_e8._M_string_length = local_b8._0_8_;
    local_88._0_8_ = (AlphaNum *)0x1;
    local_88._8_8_ = "D";
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_e8,(AlphaNum *)local_88,
               (AlphaNum *)local_b8._8_8_);
    break;
  case 6:
    value = *(float *)(this + 0x50);
    if (INFINITY <= value) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.POSITIVE_INFINITY";
      pcVar10 = "";
      goto LAB_001c231a;
    }
    if (value <= -INFINITY) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.NEGATIVE_INFINITY";
      pcVar10 = "";
      goto LAB_001c231a;
    }
    if (NAN(value)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "Float.NaN";
      pcVar10 = "";
      goto LAB_001c231a;
    }
    io::SimpleFtoa_abi_cxx11_((string *)local_b8,(io *)this,value);
    local_e8._M_dataplus._M_p = (pointer)local_b8._8_8_;
    local_e8._M_string_length = local_b8._0_8_;
    local_88._0_8_ = (AlphaNum *)0x1;
    local_88._8_8_ = "F";
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_e8,(AlphaNum *)local_88,
               (AlphaNum *)local_b8._8_8_);
    break;
  case 7:
    jVar2 = this[0x50];
    pcVar11 = "false";
    if ((ulong)(byte)jVar2 != 0) {
      pcVar11 = "true";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = pcVar11 + ((ulong)(byte)jVar2 ^ 5);
LAB_001c231a:
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar11,pcVar10);
    return __return_storage_ptr__;
  case 8:
    descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_50,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),descriptor_00
               ,SUB81(field,0));
    local_e8._M_dataplus._M_p = (pointer)local_50._M_string_length;
    local_e8._M_string_length = (size_type)local_50._M_dataplus._M_p;
    local_88._0_8_ = (AlphaNum *)0x1;
    local_88._8_8_ = ".";
    pEVar7 = FieldDescriptor::default_value_enum((FieldDescriptor *)this);
    local_b8._8_8_ = (pEVar7->all_names_->_M_dataplus)._M_p;
    local_b8._0_8_ = pEVar7->all_names_->_M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_e8,(AlphaNum *)local_88,
               (AlphaNum *)local_b8,(AlphaNum *)name_resolver);
LAB_001c2426:
    local_e8.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001c2552;
  case 9:
    if (this[2] == (java)0xc) {
      if (((byte)this[1] & 1) == 0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar11 = "com.google.protobuf.ByteString.EMPTY";
        pcVar10 = "";
        goto LAB_001c231a;
      }
      src._M_len = **(size_t **)(this + 0x50);
      absl::lts_20250127::CEscape_abi_cxx11_
                (&local_e8,(lts_20250127 *)(*(size_t **)(this + 0x50))[1],src);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      local_88._0_8_ = local_e8._M_string_length;
      local_88._8_8_ = local_e8._M_dataplus._M_p;
      format._M_str = local_88;
      format._M_len = (size_t)"com.google.protobuf.Internal.bytesDefaultValue(\"$0\")";
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x34,format,
                 (Nullable<const_absl::string_view_*>)0x1,(size_t)options);
    }
    else {
      psVar3 = *(size_t **)(this + 0x50);
      pcVar11 = (char *)psVar3[1];
      bVar13 = pcVar11 == (char *)0x0;
      if ((!bVar13) && (-1 < *(char *)*psVar3)) {
        pcVar5 = (char *)0x1;
        do {
          pcVar12 = pcVar5;
          if (pcVar11 == pcVar12) break;
          pcVar5 = pcVar12 + 1;
        } while (-1 < ((char *)*psVar3)[(long)pcVar12]);
        bVar13 = pcVar11 <= pcVar12;
      }
      if (bVar13) {
        local_e8._M_dataplus._M_p = (pointer)0x1;
        local_e8._M_string_length = 0x54f0f1;
        src_00._M_str = pcVar11;
        src_00._M_len = *psVar3;
        absl::lts_20250127::CEscape_abi_cxx11_(&local_50,(lts_20250127 *)psVar3[1],src_00);
        local_88._0_8_ = local_50._M_string_length;
        local_88._8_8_ = local_50._M_dataplus._M_p;
        local_b8._0_8_ = (AlphaNum *)0x1;
        local_b8._8_8_ = "\"";
        absl::lts_20250127::StrCat_abi_cxx11_
                  (__return_storage_ptr__,(lts_20250127 *)&local_e8,(AlphaNum *)local_88,
                   (AlphaNum *)local_b8,(AlphaNum *)name_resolver);
        goto LAB_001c2426;
      }
      src_01._M_str = pcVar11;
      src_01._M_len = *psVar3;
      absl::lts_20250127::CEscape_abi_cxx11_(&local_e8,(lts_20250127 *)psVar3[1],src_01);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      local_88._0_8_ = local_e8._M_string_length;
      local_88._8_8_ = local_e8._M_dataplus._M_p;
      format_00._M_str = local_88;
      format_00._M_len = (size_t)"com.google.protobuf.Internal.stringDefaultValue(\"$0\")";
      absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
                ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x35,
                 format_00,(Nullable<const_absl::string_view_*>)0x1,(size_t)options);
    }
    local_50._M_dataplus._M_p = local_e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001c2552;
  case 10:
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)this);
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)local_b8,(ClassNameResolver *)CONCAT71(in_register_00000009,immutable),
               descriptor,SUB81(field,0));
    local_e8._M_dataplus._M_p = (pointer)local_b8._8_8_;
    local_e8._M_string_length = local_b8._0_8_;
    local_88._0_8_ = (AlphaNum *)0x15;
    local_88._8_8_ = ".getDefaultInstance()";
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_e8,(AlphaNum *)local_88,
               (AlphaNum *)local_b8._8_8_);
  }
  local_e8.field_2._M_allocated_capacity = local_a8._0_8_;
  local_50._M_dataplus._M_p = (pointer)local_b8._0_8_;
  if ((AlphaNum *)local_b8._0_8_ == (AlphaNum *)(local_b8 + 0x10)) {
    return __return_storage_ptr__;
  }
LAB_001c2552:
  operator_delete(local_50._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultValue(const FieldDescriptor* field, bool immutable,
                         ClassNameResolver* name_resolver, Options options) {
  // Switch on CppType since we need to know which default_value_* method
  // of FieldDescriptor to call.
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return absl::StrCat(field->default_value_int32());
    case FieldDescriptor::CPPTYPE_UINT32:
      // Need to print as a signed int since Java has no unsigned.
      return absl::StrCat(static_cast<int32_t>(field->default_value_uint32()));
    case FieldDescriptor::CPPTYPE_INT64:
      return absl::StrCat(field->default_value_int64(), "L");
    case FieldDescriptor::CPPTYPE_UINT64:
      return absl::StrCat(static_cast<int64_t>(field->default_value_uint64())) +
             "L";
    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value = field->default_value_double();
      if (value == std::numeric_limits<double>::infinity()) {
        return "Double.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<double>::infinity()) {
        return "Double.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Double.NaN";
      } else {
        return absl::StrCat(io::SimpleDtoa(value), "D");
      }
    }
    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value = field->default_value_float();
      if (value == std::numeric_limits<float>::infinity()) {
        return "Float.POSITIVE_INFINITY";
      } else if (value == -std::numeric_limits<float>::infinity()) {
        return "Float.NEGATIVE_INFINITY";
      } else if (value != value) {
        return "Float.NaN";
      } else {
        return absl::StrCat(io::SimpleFtoa(value), "F");
      }
    }
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_STRING:
      if (GetType(field) == FieldDescriptor::TYPE_BYTES) {
        if (field->has_default_value()) {
          // See comments in Internal.java for gory details.
          return absl::Substitute(
              "com.google.protobuf.Internal.bytesDefaultValue(\"$0\")",
              absl::CEscape(field->default_value_string()));
        } else {
          return "com.google.protobuf.ByteString.EMPTY";
        }
      } else {
        if (AllAscii(field->default_value_string())) {
          // All chars are ASCII.  In this case CEscape() works fine.
          return absl::StrCat(
              "\"", absl::CEscape(field->default_value_string()), "\"");
        } else {
          // See comments in Internal.java for gory details.
          return absl::Substitute(
              "com.google.protobuf.Internal.stringDefaultValue(\"$0\")",
              absl::CEscape(field->default_value_string()));
        }
      }

    case FieldDescriptor::CPPTYPE_ENUM:
      return absl::StrCat(
          name_resolver->GetClassName(field->enum_type(), immutable), ".",
          field->default_value_enum()->name());

    case FieldDescriptor::CPPTYPE_MESSAGE:
      return absl::StrCat(
          name_resolver->GetClassName(field->message_type(), immutable),
          ".getDefaultInstance()");

      // No default because we want the compiler to complain if any new
      // types are added.
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return "";
}